

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void anon_unknown.dwarf_15ef17::Strengthen(uchar (*seed) [32],duration dur,CSHA512 *hasher)

{
  long lVar1;
  bool bVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  this;
  CSHA512 *in_RDX;
  long in_FS_OFFSET;
  int i;
  int64_t perf;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  stop;
  uchar buffer [64];
  CSHA512 inner_hasher;
  CSHA512 *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  strong_ordering in_stack_fffffffffffffe97;
  size_t in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int iVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA512::CSHA512(in_stack_fffffffffffffe88);
  CSHA512::Write(in_RDX,(uchar *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe98);
  std::chrono::_V2::steady_clock::now();
  this = std::chrono::operator+
                   ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe97._M_value,in_stack_fffffffffffffe90),
                    (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe88);
  do {
    for (iVar3 = 0; iVar3 < 1000; iVar3 = iVar3 + 1) {
      CSHA512::Finalize((CSHA512 *)this.__d.__r,
                        (uchar *)CONCAT17(in_stack_fffffffffffffe97._M_value,
                                          in_stack_fffffffffffffe90));
      CSHA512::Reset(in_stack_fffffffffffffe88);
      CSHA512::Write(in_RDX,(uchar *)CONCAT44(iVar3,in_stack_fffffffffffffea0),(size_t)this.__d.__r)
      ;
    }
    GetPerformanceCounter();
    CSHA512::Write(in_RDX,(uchar *)CONCAT44(iVar3,in_stack_fffffffffffffea0),(size_t)this.__d.__r);
    std::chrono::_V2::steady_clock::now();
    in_stack_fffffffffffffe97 =
         std::chrono::
         operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe97._M_value,in_stack_fffffffffffffe90),
                    (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffea0 =
         CONCAT13(in_stack_fffffffffffffe97._M_value,(int3)in_stack_fffffffffffffea0);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_fffffffffffffe88,(__unspec *)0x210ced);
    bVar2 = std::operator<((char)((uint)in_stack_fffffffffffffea0 >> 0x18));
  } while (bVar2);
  CSHA512::Finalize((CSHA512 *)this.__d.__r,
                    (uchar *)CONCAT17(in_stack_fffffffffffffe97._M_value,in_stack_fffffffffffffe90))
  ;
  CSHA512::Write(in_RDX,(uchar *)CONCAT44(iVar3,in_stack_fffffffffffffea0),(size_t)this.__d.__r);
  CSHA512::Reset(in_stack_fffffffffffffe88);
  memory_cleanse(in_stack_fffffffffffffe88,0x210d47);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Strengthen(const unsigned char (&seed)[32], SteadyClock::duration dur, CSHA512& hasher) noexcept
{
    CSHA512 inner_hasher;
    inner_hasher.Write(seed, sizeof(seed));

    // Hash loop
    unsigned char buffer[64];
    const auto stop{SteadyClock::now() + dur};
    do {
        for (int i = 0; i < 1000; ++i) {
            inner_hasher.Finalize(buffer);
            inner_hasher.Reset();
            inner_hasher.Write(buffer, sizeof(buffer));
        }
        // Benchmark operation and feed it into outer hasher.
        int64_t perf = GetPerformanceCounter();
        hasher.Write((const unsigned char*)&perf, sizeof(perf));
    } while (SteadyClock::now() < stop);

    // Produce output from inner state and feed it to outer hasher.
    inner_hasher.Finalize(buffer);
    hasher.Write(buffer, sizeof(buffer));
    // Try to clean up.
    inner_hasher.Reset();
    memory_cleanse(buffer, sizeof(buffer));
}